

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPUtils.cpp
# Opt level: O0

bool net_uv::kcp_grab_syn_and_ack_value(char *data,uint32_t len,uint32_t *pValue,uint32_t *pConv)

{
  uint32_t uVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  char *in_R8;
  allocator<char> local_c9;
  string local_c8;
  allocator local_91;
  string local_90;
  ulong local_70;
  size_type convPos;
  size_type valuePos;
  uint local_58;
  uint32_t convKeyLen;
  uint32_t valueKeyLen;
  string str;
  uint32_t *pConv_local;
  uint32_t *pValue_local;
  uint32_t len_local;
  char *data_local;
  
  if (pValue != (uint32_t *)0x0) {
    *pValue = 0;
  }
  if (pConv != (uint32_t *)0x0) {
    *pConv = 0;
  }
  str.field_2._8_8_ = pConv;
  get_kcp_packet_info_abi_cxx11_
            ((string *)&valueKeyLen,(net_uv *)data,(char *)(ulong)len,0x1dac46,in_R8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    sVar3 = strlen(kcp_grab_syn_and_ack_value::valueKey);
    local_58 = (uint)sVar3;
    sVar3 = strlen(kcp_grab_syn_and_ack_value::convKey);
    valuePos._4_4_ = (uint)sVar3;
    convPos = std::__cxx11::string::find
                        ((char *)&valueKeyLen,(ulong)kcp_grab_syn_and_ack_value::valueKey);
    local_70 = std::__cxx11::string::find
                         ((char *)&valueKeyLen,(ulong)kcp_grab_syn_and_ack_value::convKey);
    if (((convPos == 0xffffffffffffffff) || (local_70 == 0xffffffffffffffff)) ||
       (local_70 < local_58)) {
      data_local._7_1_ = false;
    }
    else {
      if (pValue != (uint32_t *)0x0) {
        lVar4 = std::__cxx11::string::c_str();
        uVar5 = (ulong)local_58;
        uVar2 = local_70 - uVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_90,(char *)(lVar4 + uVar5),uVar2,&local_91);
        uVar1 = a2l_safe(&local_90);
        *pValue = uVar1;
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
      if (str.field_2._8_8_ != 0) {
        lVar4 = std::__cxx11::string::c_str();
        lVar4 = lVar4 + local_70;
        uVar2 = (ulong)valuePos._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,(char *)(lVar4 + uVar2),&local_c9);
        uVar1 = a2l_safe(&local_c8);
        *(uint32_t *)str.field_2._8_8_ = uVar1;
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      data_local._7_1_ = true;
    }
  }
  else {
    data_local._7_1_ = false;
  }
  convKeyLen = 1;
  std::__cxx11::string::~string((string *)&valueKeyLen);
  return data_local._7_1_;
}

Assistant:

bool kcp_grab_syn_and_ack_value(const char* data, uint32_t len, uint32_t* pValue, uint32_t* pConv)
{
	if (pValue) *pValue = 0;
	if (pConv) *pConv = 0;

	std::string str = get_kcp_packet_info(data, len, NET_KCP_SYN_AND_ACK_PACKET);
	if (str.empty())
	{
		return false;
	}

	static const char* valueKey = " value:";
	static const char* convKey = " conv:";

	uint32_t valueKeyLen = strlen(valueKey);
	uint32_t convKeyLen = strlen(convKey);

	auto valuePos = str.find(valueKey);
	auto convPos = str.find(convKey);

	if (valuePos == std::string::npos || convPos == std::string::npos || convPos < valueKeyLen)
	{
		return false;
	}

	if (pValue) *pValue = a2l_safe(std::string(str.c_str() + valueKeyLen, convPos - valueKeyLen));
	if (pConv) *pConv = a2l_safe(std::string(str.c_str() + convPos + convKeyLen));

	return true;
}